

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

boolean wishymatch(char *u_str,char *o_str,boolean retry_inverted)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char buf [256];
  
  pcVar6 = buf;
  if ((flags.debug != '\0') && (iVar2 = strcmp(o_str,"beartrap"), iVar2 == 0)) {
    iVar2 = strncasecmp(o_str,u_str,8);
    return iVar2 == 0;
  }
  bVar1 = fuzzymatch(u_str,o_str," -",'\x01');
  if (bVar1 != '\0') {
    return '\x01';
  }
  if (retry_inverted == '\0') {
LAB_001fb729:
    iVar2 = strncmp(o_str,"dwarvish ",9);
    if (iVar2 == 0) {
      iVar2 = strncasecmp(u_str,"dwarven ",8);
      if (iVar2 != 0) {
        return '\0';
      }
      pcVar3 = u_str + 8;
      pcVar6 = o_str + 9;
    }
    else {
      iVar2 = strncmp(o_str,"elven ",6);
      if (iVar2 == 0) {
        iVar2 = strncasecmp(u_str,"elvish ",7);
        if (iVar2 == 0) {
          pcVar3 = u_str + 7;
        }
        else {
          iVar2 = strncasecmp(u_str,"elfin ",6);
          if (iVar2 != 0) {
            return '\0';
          }
          pcVar3 = u_str + 6;
        }
        pcVar6 = o_str + 6;
      }
      else {
        iVar2 = strcmp(o_str,"aluminum");
        if (iVar2 != 0) {
          return '\0';
        }
        iVar2 = strncasecmp(u_str,"aluminium",0xffffffffffffffff);
        if (iVar2 != 0) {
          return '\0';
        }
        pcVar3 = u_str + 9;
        pcVar6 = o_str + 8;
      }
    }
    bVar1 = fuzzymatch(pcVar3,pcVar6," -",'\x01');
    return bVar1;
  }
  pcVar3 = strstri(u_str," of ");
  pcVar4 = strstri(o_str," of ");
  if (pcVar4 == (char *)0x0 && pcVar3 != (char *)0x0) {
    strcpy(buf,pcVar3 + 4);
    sVar5 = strlen(buf);
    (buf + sVar5)[0] = ' ';
    (buf + sVar5)[1] = '\0';
    pcVar4 = eos(buf);
    for (; u_str < pcVar3; u_str = u_str + 1) {
      *pcVar4 = *u_str;
      pcVar4 = pcVar4 + 1;
    }
    *pcVar4 = '\0';
  }
  else {
    if (pcVar3 != (char *)0x0 || pcVar4 == (char *)0x0) goto LAB_001fb729;
    strcpy(buf,pcVar4 + 4);
    sVar5 = strlen(buf);
    (buf + sVar5)[0] = ' ';
    (buf + sVar5)[1] = '\0';
    pcVar6 = eos(buf);
    for (; o_str < pcVar4; o_str = o_str + 1) {
      *pcVar6 = *o_str;
      pcVar6 = pcVar6 + 1;
    }
    *pcVar6 = '\0';
    o_str = buf;
    pcVar6 = u_str;
  }
  bVar1 = fuzzymatch(pcVar6,o_str," -",'\x01');
  return bVar1;
}

Assistant:

static boolean wishymatch(const char *u_str,	/* from user, so might be variant spelling */
			  const char *o_str,	/* from objects[], so is in canonical form */
			  boolean retry_inverted)	/* optional extra "of" handling */
{
	/* special case: wizards can wish for traps.  The object is "beartrap"
	 * and the trap is "bear trap", so to let wizards wish for both we
	 * must not fuzzymatch.
	 */
	if (wizard && !strcmp(o_str, "beartrap"))
	    return !strncmpi(o_str, u_str, 8);

	/* ignore spaces & hyphens and upper/lower case when comparing */
	if (fuzzymatch(u_str, o_str, " -", TRUE)) return TRUE;

	if (retry_inverted) {
	    const char *u_of, *o_of;
	    char *p, buf[BUFSZ];

	    /* when just one of the strings is in the form "foo of bar",
	       convert it into "bar foo" and perform another comparison */
	    u_of = strstri(u_str, " of ");
	    o_of = strstri(o_str, " of ");
	    if (u_of && !o_of) {
		strcpy(buf, u_of + 4);
		p = eos(strcat(buf, " "));
		while (u_str < u_of) *p++ = *u_str++;
		*p = '\0';
		return fuzzymatch(buf, o_str, " -", TRUE);
	    } else if (o_of && !u_of) {
		strcpy(buf, o_of + 4);
		p = eos(strcat(buf, " "));
		while (o_str < o_of) *p++ = *o_str++;
		*p = '\0';
		return fuzzymatch(u_str, buf, " -", TRUE);
	    }
	}

	/* [note: if something like "elven speed boots" ever gets added, these
	   special cases should be changed to call wishymatch() recursively in
	   order to get the "of" inversion handling] */
	if (!strncmp(o_str, "dwarvish ", 9)) {
	    if (!strncmpi(u_str, "dwarven ", 8))
		return fuzzymatch(u_str + 8, o_str + 9, " -", TRUE);
	} else if (!strncmp(o_str, "elven ", 6)) {
	    if (!strncmpi(u_str, "elvish ", 7))
		return fuzzymatch(u_str + 7, o_str + 6, " -", TRUE);
	    else if (!strncmpi(u_str, "elfin ", 6))
		return fuzzymatch(u_str + 6, o_str + 6, " -", TRUE);
	} else if (!strcmp(o_str, "aluminum")) {
		/* this special case doesn't really fit anywhere else... */
		/* (note that " wand" will have been stripped off by now) */
	    if (!strcmpi(u_str, "aluminium"))
		return fuzzymatch(u_str + 9, o_str + 8, " -", TRUE);
	}

	return FALSE;
}